

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.h
# Opt level: O3

int mpt::type_properties<mpt::color_*>::id(bool obtain)

{
  int iVar1;
  type_traits *traits;
  
  iVar1 = -3;
  if (0 < id::_valtype) {
    iVar1 = id::_valtype;
  }
  if (id::_valtype < 1 && obtain) {
    traits = type_properties<mpt::color_*>::traits();
    iVar1 = type_traits::add(traits);
    id::_valtype = iVar1;
  }
  return iVar1;
}

Assistant:

static int id(bool obtain = false) {
		static int _valtype = 0;
		if (_valtype > 0) {
			return _valtype;
		}
		if (!obtain) {
			return BadType;
		}
		return _valtype = type_traits::add(*traits());
	}